

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O2

void __thiscall
should_be_able_to_return_value_in_visitor::Visitor::doAssert(Visitor *this,Ref *header,Ref *logon)

{
  bool bVar1;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *message;
  Values *this_00;
  AssertionResult *this_01;
  char *pcVar2;
  char *in_R9;
  undefined1 local_ce8 [8];
  Values msgTypes;
  string senderCompId;
  string refMsgType;
  AssertionResult gtest_ar_2;
  AssertHelper local_40;
  AssertHelper local_38;
  AssertionResult gtest_ar__1;
  char msgDirection;
  
  msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer._304_8_ =
       &senderCompId._M_string_length;
  senderCompId._M_dataplus._M_p = (pointer)0x0;
  senderCompId._M_string_length._0_1_ = 0;
  bVar1 = Fixpp::
          tryGet<Fixpp::TagT<49u,Fixpp::Type::String>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>
                    (header,(UnderlyingType *)
                            (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                             buffer + 0x130));
  this_00 = (Values *)&refMsgType;
  senderCompId.field_2._M_local_buf[8] = bVar1;
  refMsgType._M_dataplus._M_p = (pointer)0x0;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
              ((internal *)local_ce8,"senderCompId","\"ABC\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130),
               (char (*) [4])0xb0c257);
    if (local_ce8[0] != (internal)0x0) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&msgTypes);
      Fixpp::
      get<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                ((Values *)local_ce8,(Fixpp *)logon,message);
      refMsgType.field_2._8_8_ =
           ((long)msgTypes.
                  super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                  .
                  super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                  .super_SmallVectorBase.BeginX - CONCAT71(local_ce8._1_7_,local_ce8[0])) / 0x138;
      local_38.data_._0_1_ = '\x02';
      local_38.data_._1_1_ = '\0';
      local_38.data_._2_1_ = '\0';
      local_38.data_._3_1_ = '\0';
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)(senderCompId.field_2._M_local_buf + 8),"msgTypes.size()","2",
                 (unsigned_long *)(refMsgType.field_2._M_local_buf + 8),(int *)&local_38);
      if (senderCompId.field_2._M_local_buf[8] == '\0') {
        testing::Message::Message((Message *)((long)&refMsgType.field_2 + 8));
        if (refMsgType._M_dataplus._M_p == (pointer)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)refMsgType._M_dataplus._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x78,pcVar2);
        testing::internal::AssertHelper::operator=
                  (&local_38,(Message *)((long)&refMsgType.field_2 + 8));
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&refMsgType.field_2 + 8));
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&refMsgType);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&refMsgType);
        senderCompId.field_2._8_8_ = &refMsgType._M_string_length;
        refMsgType._M_dataplus._M_p = (pointer)0x0;
        refMsgType._M_string_length._0_1_ = 0;
        if ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
             *)msgTypes.
               super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
               .
               super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
               .
               super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
               .super_SmallVectorBase.BeginX ==
            (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
             *)CONCAT71(local_ce8._1_7_,local_ce8[0])) {
LAB_00ac7f75:
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                        ,0x182,
                        "reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) [T = Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                       );
        }
        bVar1 = Fixpp::
                tryGet<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                          ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                            *)CONCAT71(local_ce8._1_7_,local_ce8[0]),
                           (UnderlyingType *)((long)&senderCompId.field_2 + 8));
        this_01 = &gtest_ar__1;
        local_38.data_._0_1_ = bVar1;
        gtest_ar__1.success_ = false;
        gtest_ar__1._1_7_ = 0;
        if (bVar1) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_01);
          testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
                    ((internal *)(refMsgType.field_2._M_local_buf + 8),"refMsgType","\"TEST\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&senderCompId.field_2 + 8),(char (*) [5])"TEST");
          if (refMsgType.field_2._M_local_buf[8] == '\0') {
            testing::Message::Message((Message *)&local_38);
            if (gtest_ar_2._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar_2._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffffe0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x7e,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffffe0,(Message *)&local_38);
LAB_00ac7e42:
            this_01 = &gtest_ar_2;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffe0)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_38);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_2);
            if ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                 *)msgTypes.
                   super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                   .
                   super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                   .
                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                   .super_SmallVectorBase.BeginX ==
                (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                 *)CONCAT71(local_ce8._1_7_,local_ce8[0])) goto LAB_00ac7f75;
            bVar1 = Fixpp::
                    tryGet<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                              ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                *)CONCAT71(local_ce8._1_7_,local_ce8[0]),
                               (UnderlyingType *)((long)&gtest_ar__1.message_.ptr_ + 7));
            local_38.data_._0_1_ = bVar1;
            gtest_ar__1.success_ = false;
            gtest_ar__1._1_7_ = 0;
            if (!bVar1) {
              testing::Message::Message((Message *)&stack0xffffffffffffffe0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)((long)&refMsgType.field_2 + 8),(internal *)&local_38,
                         (AssertionResult *)
                         "Fixpp::tryGet<Fixpp::Tag::MsgDirection>(msgTypes[0], msgDirection)",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_40,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x80,(char *)refMsgType.field_2._8_8_);
              testing::internal::AssertHelper::operator=
                        (&local_40,(Message *)&stack0xffffffffffffffe0);
              goto LAB_00ac7d38;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this_01);
            local_38.data_._0_1_ = 'C';
            testing::internal::CmpHelperEQ<char,char>
                      ((internal *)(refMsgType.field_2._M_local_buf + 8),"msgDirection","\'C\'",
                       (char *)((long)&gtest_ar__1.message_.ptr_ + 7),(char *)&local_38);
            if (refMsgType.field_2._M_local_buf[8] == '\0') {
              testing::Message::Message((Message *)&local_38);
              if (gtest_ar_2._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar_2._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffffe0,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x81,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffffe0,(Message *)&local_38);
              goto LAB_00ac7e42;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_2);
            if ((ulong)(((long)msgTypes.
                               super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                               .
                               super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                               .
                               super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                               .super_SmallVectorBase.BeginX -
                        CONCAT71(local_ce8._1_7_,local_ce8[0])) / 0x138) < 2) goto LAB_00ac7f75;
            bVar1 = Fixpp::
                    tryGet<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                              ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                *)(CONCAT71(local_ce8._1_7_,local_ce8[0]) + 0x138),
                               (UnderlyingType *)((long)&senderCompId.field_2 + 8));
            local_38.data_._0_1_ = bVar1;
            gtest_ar__1.success_ = false;
            gtest_ar__1._1_7_ = 0;
            if (!bVar1) {
              testing::Message::Message((Message *)&stack0xffffffffffffffe0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)((long)&refMsgType.field_2 + 8),(internal *)&local_38,
                         (AssertionResult *)
                         "Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[1], refMsgType)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_40,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x83,(char *)refMsgType.field_2._8_8_);
              testing::internal::AssertHelper::operator=
                        (&local_40,(Message *)&stack0xffffffffffffffe0);
              goto LAB_00ac7d38;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this_01);
            testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
                      ((internal *)(refMsgType.field_2._M_local_buf + 8),"refMsgType","\"TEST\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&senderCompId.field_2 + 8),(char (*) [5])"TEST");
            if (refMsgType.field_2._M_local_buf[8] == '\0') {
              testing::Message::Message((Message *)&local_38);
              if (gtest_ar_2._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar_2._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffffe0,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x84,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffffe0,(Message *)&local_38);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffffe0);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_38);
            }
            this_01 = &gtest_ar_2;
          }
        }
        else {
          testing::Message::Message((Message *)&stack0xffffffffffffffe0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)((long)&refMsgType.field_2 + 8),(internal *)&local_38,
                     (AssertionResult *)
                     "Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[0], refMsgType)","false","true"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x7d,(char *)refMsgType.field_2._8_8_);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&stack0xffffffffffffffe0);
LAB_00ac7d38:
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          std::__cxx11::string::~string((string *)(refMsgType.field_2._M_local_buf + 8));
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xffffffffffffffe0);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_01);
        std::__cxx11::string::~string((string *)(senderCompId.field_2._M_local_buf + 8));
      }
      llvm::
      SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
      ::~SmallVectorImpl((SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                          *)local_ce8);
      goto LAB_00ac7e75;
    }
    testing::Message::Message((Message *)((long)&senderCompId.field_2 + 8));
    if (msgTypes.
        super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
        .
        super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
        .
        super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
        .super_SmallVectorBase.BeginX == (void *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *msgTypes.
                super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                .
                super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                .
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                .super_SmallVectorBase.BeginX;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&refMsgType.field_2 + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&refMsgType.field_2 + 8),
               (Message *)((long)&senderCompId.field_2 + 8));
    this_00 = &msgTypes;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&refMsgType.field_2 + 8));
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&senderCompId.field_2 + 8));
  }
  else {
    testing::Message::Message((Message *)((long)&refMsgType.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_ce8,(internal *)(senderCompId.field_2._M_local_buf + 8),
               (AssertionResult *)"Fixpp::tryGet<Fixpp::Tag::SenderCompID>(header, senderCompId)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x74,(char *)CONCAT71(local_ce8._1_7_,local_ce8[0]));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)((long)&refMsgType.field_2 + 8))
    ;
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    std::__cxx11::string::~string((string *)local_ce8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&refMsgType.field_2 + 8));
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00);
LAB_00ac7e75:
  std::__cxx11::string::~string
            ((string *)
             (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130));
  return;
}

Assistant:

void doAssert(const Fixpp::v42::Header::Ref& header, const Fixpp::v42::Message::Logon::Ref& logon)
        {
            std::string senderCompId;
            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::SenderCompID>(header, senderCompId));
            ASSERT_EQ(senderCompId, "ABC");

            auto msgTypes = Fixpp::get<Fixpp::Tag::NoMsgTypes>(logon);
            ASSERT_EQ(msgTypes.size(), 2);

            std::string refMsgType;
            char msgDirection;

            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[0], refMsgType));
            ASSERT_EQ(refMsgType, "TEST");

            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::MsgDirection>(msgTypes[0], msgDirection));
            ASSERT_EQ(msgDirection, 'C');

            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[1], refMsgType));
            ASSERT_EQ(refMsgType, "TEST");
        }